

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void forlist(LexState *ls,TString *indexname)

{
  byte bVar1;
  int iVar2;
  int nexps;
  TString *pTVar3;
  int base;
  int line;
  int nvars;
  expdesc e;
  FuncState *fs;
  TString *indexname_local;
  LexState *ls_local;
  
  e._16_8_ = ls->fs;
  base = 5;
  bVar1 = ((FuncState *)e._16_8_)->freereg;
  pTVar3 = luaX_newstring(ls,"(for state)",0xb);
  new_localvar(ls,pTVar3);
  pTVar3 = luaX_newstring(ls,"(for state)",0xb);
  new_localvar(ls,pTVar3);
  pTVar3 = luaX_newstring(ls,"(for state)",0xb);
  new_localvar(ls,pTVar3);
  pTVar3 = luaX_newstring(ls,"(for state)",0xb);
  new_localvar(ls,pTVar3);
  new_localvar(ls,indexname);
  while( true ) {
    iVar2 = testnext(ls,0x2c);
    if (iVar2 == 0) break;
    pTVar3 = str_checkname(ls);
    new_localvar(ls,pTVar3);
    base = base + 1;
  }
  checknext(ls,0x10b);
  iVar2 = ls->linenumber;
  nexps = explist(ls,(expdesc *)&line);
  adjust_assign(ls,4,nexps,(expdesc *)&line);
  adjustlocalvars(ls,4);
  marktobeclosed((FuncState *)e._16_8_);
  luaK_checkstack((FuncState *)e._16_8_,3);
  forbody(ls,(uint)bVar1,iVar2,base + -4,1);
  return;
}

Assistant:

static void forlist (LexState *ls, TString *indexname) {
  /* forlist -> NAME {,NAME} IN explist forbody */
  FuncState *fs = ls->fs;
  expdesc e;
  int nvars = 5;  /* gen, state, control, toclose, 'indexname' */
  int line;
  int base = fs->freereg;
  /* create control variables */
  new_localvarliteral(ls, "(for state)");
  new_localvarliteral(ls, "(for state)");
  new_localvarliteral(ls, "(for state)");
  new_localvarliteral(ls, "(for state)");
  /* create declared variables */
  new_localvar(ls, indexname);
  while (testnext(ls, ',')) {
    new_localvar(ls, str_checkname(ls));
    nvars++;
  }
  checknext(ls, TK_IN);
  line = ls->linenumber;
  adjust_assign(ls, 4, explist(ls, &e), &e);
  adjustlocalvars(ls, 4);  /* control variables */
  marktobeclosed(fs);  /* last control var. must be closed */
  luaK_checkstack(fs, 3);  /* extra space to call generator */
  forbody(ls, base, line, nvars - 4, 1);
}